

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O3

bool __thiscall
phyr::Sphere::intersectRay(Sphere *this,Ray *ray,double *t0,SurfaceInteraction *si,bool testAlpha)

{
  double dVar1;
  Transform *this_00;
  FPError a;
  FPError b_00;
  FPError c;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  long lVar6;
  FPError *pFVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  double dVar14;
  undefined1 auVar13 [16];
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  FPError local_658;
  FPError t2;
  FPError t1;
  double local_5f8;
  FPError b;
  Ray lr;
  FPError dz;
  FPError oz;
  FPError oy;
  FPError ox;
  FPError local_4e8;
  FPError dy;
  FPError dx;
  Point2f local_498;
  Vector3f local_488;
  Vector3f local_468;
  Normal3f local_448;
  Normal3f local_428;
  Vector3f local_408;
  Vector3f rdErr;
  Vector3f roErr;
  SurfaceInteraction local_3a8;
  SurfaceInteraction local_1e8;
  
  roErr.x = 0.0;
  roErr.y = 0.0;
  roErr.z = 0.0;
  rdErr.z = 0.0;
  rdErr.x = 0.0;
  rdErr.y = 0.0;
  Transform::operator()((this->super_Shape).worldToLocal,ray,&roErr,&rdErr);
  FPError::FPError(&ox,lr.o.x,roErr.x);
  FPError::FPError(&oy,lr.o.y,roErr.y);
  FPError::FPError(&oz,lr.o.z,roErr.z);
  FPError::FPError(&dx,lr.d.x,rdErr.x);
  FPError::FPError(&dy,lr.d.y,rdErr.y);
  FPError::FPError(&dz,lr.d.z,rdErr.z);
  FPError::operator*((FPError *)&local_3a8,&dx,&dx);
  FPError::operator*((FPError *)&local_1e8,&dy,&dy);
  dVar1 = local_1e8.super_Interaction.p.x;
  dVar17 = local_3a8.super_Interaction.p.x;
  local_3a8.super_Interaction.p.y =
       local_3a8.super_Interaction.p.y + local_1e8.super_Interaction.p.y;
  dVar3 = -INFINITY;
  if (-INFINITY < local_3a8.super_Interaction.p.y) {
    dVar3 = (double)(~-(ulong)(local_3a8.super_Interaction.p.y == 0.0) &
                     (ulong)local_3a8.super_Interaction.p.y |
                    -(ulong)(local_3a8.super_Interaction.p.y == 0.0) & 0x8000000000000000);
    dVar3 = (double)((long)dVar3 + (ulong)(dVar3 <= 0.0) * 2 + -1);
  }
  local_3a8.super_Interaction.p.z =
       local_3a8.super_Interaction.p.z + local_1e8.super_Interaction.p.z;
  dVar4 = INFINITY;
  if (local_3a8.super_Interaction.p.z < INFINITY) {
    local_3a8.super_Interaction.p.z =
         (double)(~-(ulong)(local_3a8.super_Interaction.p.z == 0.0) &
                 (ulong)local_3a8.super_Interaction.p.z);
    dVar4 = (double)((-(ulong)(local_3a8.super_Interaction.p.z < 0.0) | 1) +
                    (long)local_3a8.super_Interaction.p.z);
  }
  FPError::operator*(&b,&dz,&dz);
  dVar15 = b.v;
  dVar3 = dVar3 + b.lBound;
  if (-INFINITY < dVar3) {
    dVar3 = (double)(~-(ulong)(dVar3 == 0.0) & (ulong)dVar3 |
                    -(ulong)(dVar3 == 0.0) & 0x8000000000000000);
    lVar8 = (long)dVar3 + (ulong)(dVar3 <= 0.0) * 2 + -1;
  }
  else {
    lVar8 = -0x10000000000000;
  }
  dVar4 = dVar4 + b.uBound;
  if (dVar4 < INFINITY) {
    dVar4 = (double)(~-(ulong)(dVar4 == 0.0) & (ulong)dVar4);
    dVar4 = (double)((-(ulong)(dVar4 < 0.0) | 1) + (long)dVar4);
  }
  else {
    dVar4 = INFINITY;
  }
  FPError::operator*(&t1,&ox,&dx);
  FPError::operator*(&t2,&oy,&dy);
  dVar11 = t1.v;
  dVar3 = t2.v;
  dVar9 = t1.lBound + t2.lBound;
  dVar5 = -INFINITY;
  if (-INFINITY < dVar9) {
    dVar5 = (double)(~-(ulong)(dVar9 == 0.0) & (ulong)dVar9 |
                    -(ulong)(dVar9 == 0.0) & 0x8000000000000000);
    dVar5 = (double)((long)dVar5 + (ulong)(dVar5 <= 0.0) * 2 + -1);
  }
  dVar10 = t1.uBound + t2.uBound;
  dVar9 = INFINITY;
  if (dVar10 < INFINITY) {
    dVar10 = (double)(~-(ulong)(dVar10 == 0.0) & (ulong)dVar10);
    dVar9 = (double)((-(ulong)(dVar10 < 0.0) | 1) + (long)dVar10);
  }
  FPError::operator*(&local_658,&oz,&dz);
  dVar5 = dVar5 + local_658.lBound;
  if (-INFINITY < dVar5) {
    dVar5 = (double)(~-(ulong)(dVar5 == 0.0) & (ulong)dVar5 |
                    -(ulong)(dVar5 == 0.0) & 0x8000000000000000);
    local_1e8.super_Interaction.p.y = (double)((long)dVar5 + (ulong)(dVar5 <= 0.0) * 2 + -1);
  }
  else {
    local_1e8.super_Interaction.p.y = -INFINITY;
  }
  dVar9 = dVar9 + local_658.uBound;
  if (dVar9 < INFINITY) {
    dVar9 = (double)(~-(ulong)(dVar9 == 0.0) & (ulong)dVar9);
    local_1e8.super_Interaction.p.z = (double)((-(ulong)(dVar9 < 0.0) | 1) + (long)dVar9);
  }
  else {
    local_1e8.super_Interaction.p.z = INFINITY;
  }
  local_1e8.super_Interaction.p.x = dVar11 + dVar3 + local_658.v;
  local_3a8.super_Interaction.p.z = 2.0;
  local_3a8.super_Interaction.p.x = 2.0;
  local_3a8.super_Interaction.p.y = 2.0;
  FPError::operator*(&b,(FPError *)&local_3a8,(FPError *)&local_1e8);
  FPError::operator*((FPError *)&local_3a8,&ox,&ox);
  FPError::operator*((FPError *)&local_1e8,&oy,&oy);
  dVar11 = local_1e8.super_Interaction.p.x;
  dVar3 = local_3a8.super_Interaction.p.x;
  dVar9 = local_3a8.super_Interaction.p.y + local_1e8.super_Interaction.p.y;
  dVar5 = -INFINITY;
  if (-INFINITY < dVar9) {
    dVar5 = (double)(~-(ulong)(dVar9 == 0.0) & (ulong)dVar9 |
                    -(ulong)(dVar9 == 0.0) & 0x8000000000000000);
    dVar5 = (double)((long)dVar5 + (ulong)(dVar5 <= 0.0) * 2 + -1);
  }
  dVar10 = local_3a8.super_Interaction.p.z + local_1e8.super_Interaction.p.z;
  dVar9 = INFINITY;
  if (dVar10 < INFINITY) {
    dVar10 = (double)(~-(ulong)(dVar10 == 0.0) & (ulong)dVar10);
    dVar9 = (double)((-(ulong)(dVar10 < 0.0) | 1) + (long)dVar10);
  }
  FPError::operator*(&t1,&oz,&oz);
  dVar5 = dVar5 + t1.lBound;
  dVar10 = -INFINITY;
  if (-INFINITY < dVar5) {
    dVar5 = (double)(~-(ulong)(dVar5 == 0.0) & (ulong)dVar5 |
                    -(ulong)(dVar5 == 0.0) & 0x8000000000000000);
    dVar10 = (double)((long)dVar5 + (ulong)(dVar5 <= 0.0) * 2 + -1);
  }
  dVar9 = dVar9 + t1.uBound;
  dVar5 = INFINITY;
  if (dVar9 < INFINITY) {
    dVar9 = (double)(~-(ulong)(dVar9 == 0.0) & (ulong)dVar9);
    dVar5 = (double)((-(ulong)(dVar9 < 0.0) | 1) + (long)dVar9);
  }
  local_658.v = this->radius;
  local_658.lBound = local_658.v;
  local_658.uBound = local_658.v;
  local_4e8.v = local_658.v;
  local_4e8.lBound = local_658.v;
  local_4e8.uBound = local_658.v;
  FPError::operator*(&t2,&local_658,&local_4e8);
  dVar10 = dVar10 - t2.lBound;
  if (-INFINITY < dVar10) {
    dVar9 = (double)(~-(ulong)(dVar10 == 0.0) & (ulong)dVar10 |
                    -(ulong)(dVar10 == 0.0) & 0x8000000000000000);
    lVar6 = (long)dVar9 + (ulong)(dVar9 <= 0.0) * 2 + -1;
  }
  else {
    lVar6 = -0x10000000000000;
  }
  dVar5 = dVar5 - t2.uBound;
  if (dVar5 < INFINITY) {
    dVar5 = (double)(~-(ulong)(dVar5 == 0.0) & (ulong)dVar5);
    dVar5 = (double)((-(ulong)(dVar5 < 0.0) | 1) + (long)dVar5);
  }
  else {
    dVar5 = INFINITY;
  }
  a.lBound = (double)lVar8;
  a.v = dVar17 + dVar1 + dVar15;
  a.uBound = dVar4;
  b_00.lBound = b.lBound;
  b_00.v = b.v;
  b_00.uBound = b.uBound;
  c.lBound = (double)lVar6;
  c.v = (dVar3 + dVar11 + t1.v) - t2.v;
  c.uBound = dVar5;
  bVar2 = solveQuadraticSystem(a,b_00,c,&t1,&t2);
  if (bVar2) {
    if (lr.tMax < t1.uBound) {
      return false;
    }
    if (t2.lBound <= 0.0) {
      return false;
    }
    pFVar7 = &t1;
    if ((0.0 < t1.lBound) || (pFVar7 = &t2, t1.uBound = t2.uBound, t2.uBound <= lr.tMax)) {
      dVar17 = pFVar7->v;
      local_658.v = dVar17 * lr.d.x + lr.o.x;
      dVar1 = this->radius;
      local_658.lBound = dVar17 * lr.d.y + lr.o.y;
      dVar3 = dVar17 * lr.d.z + lr.o.z;
      local_658.uBound =
           dVar1 / SQRT(dVar3 * dVar3 +
                        local_658.v * local_658.v + local_658.lBound * local_658.lBound);
      local_658.v = local_658.v * local_658.uBound;
      local_658.lBound = local_658.uBound * local_658.lBound;
      local_658.uBound = local_658.uBound * dVar3;
      dVar3 = this->zMin;
      if (((-dVar1 < dVar3) && (local_658.uBound < dVar3)) ||
         ((this->zMax < dVar1 && (this->zMax < local_658.uBound)))) {
        if (lr.tMax < t1.uBound) {
          return false;
        }
        if ((dVar17 == t2.v) && (!NAN(dVar17) && !NAN(t2.v))) {
          return false;
        }
        local_658.v = lr.o.x + lr.d.x * t2.v;
        local_658.lBound = lr.o.y + lr.d.y * t2.v;
        dVar17 = lr.o.z + lr.d.z * t2.v;
        local_658.uBound =
             dVar1 / SQRT(dVar17 * dVar17 +
                          local_658.v * local_658.v + local_658.lBound * local_658.lBound);
        local_658.v = local_658.v * local_658.uBound;
        local_658.lBound = local_658.uBound * local_658.lBound;
        local_658.uBound = local_658.uBound * dVar17;
        if ((-dVar1 < dVar3) && (local_658.uBound < dVar3)) {
          return false;
        }
        dVar17 = t2.v;
        if ((this->zMax < dVar1) && (this->zMax < local_658.uBound)) {
          return false;
        }
      }
      dVar3 = local_658.uBound;
      dVar1 = local_658.lBound;
      *t0 = dVar17;
      dVar17 = this->thetaMax - this->thetaMin;
      if ((((local_658.v == 0.0) && (!NAN(local_658.v))) && (local_658.lBound == 0.0)) &&
         (!NAN(local_658.lBound))) {
        local_658.v = this->radius * 9.999999747378752e-06;
      }
      dVar4 = local_658.v;
      dVar11 = atan2(local_658.lBound,local_658.v);
      dVar5 = dVar3 / this->radius;
      dVar15 = -1.0;
      if (-1.0 <= dVar5) {
        dVar15 = dVar5;
      }
      dVar5 = 1.0;
      if (dVar15 <= 1.0) {
        dVar5 = dVar15;
      }
      dVar5 = acos(dVar5);
      dVar15 = this->thetaMin;
      dVar16 = 1.0 / SQRT(dVar4 * dVar4 + dVar1 * dVar1);
      dVar10 = dVar1 * -6.283185307179586;
      dVar14 = dVar4 * 6.283185307179586;
      local_4e8.uBound = 0.0;
      local_5f8 = -this->radius;
      local_4e8.v = dVar10;
      local_4e8.lBound = dVar14;
      dVar9 = sin(dVar5);
      dVar18 = dVar16 * dVar4;
      dVar16 = dVar16 * dVar1;
      local_408.x = dVar17 * dVar18 * dVar3;
      local_408.y = dVar17 * dVar16 * dVar3;
      dVar19 = dVar17 * dVar3 * 6.283185307179586;
      dVar23 = -dVar17 * dVar17;
      dVar20 = dVar10 * dVar10 + dVar14 * dVar14;
      local_408.z = dVar9 * local_5f8 * dVar17;
      dVar25 = local_408.z * 0.0 + dVar10 * local_408.x + local_408.y * dVar14;
      dVar21 = local_408.z * local_408.z + local_408.x * local_408.x + local_408.y * local_408.y;
      dVar26 = dVar14 * local_408.z + local_408.y * -0.0;
      dVar27 = local_408.x * 0.0 - local_408.z * dVar10;
      dVar9 = dVar10 * local_408.y - local_408.x * dVar14;
      dVar24 = 1.0 / SQRT(dVar9 * dVar9 + dVar26 * dVar26 + dVar27 * dVar27);
      dVar26 = dVar26 * dVar24;
      dVar27 = dVar27 * dVar24;
      dVar24 = dVar24 * dVar9;
      dVar22 = dVar24 * -0.0 +
               dVar4 * -39.47841760435743 * dVar26 + dVar1 * -39.47841760435743 * dVar27;
      dVar9 = dVar19 * 0.0 * dVar24 + (dVar18 * dVar19 * dVar27 - dVar16 * dVar19 * dVar26);
      dVar19 = dVar24 * dVar23 * dVar3 + dVar26 * dVar4 * dVar23 + dVar27 * dVar23 * dVar1;
      dVar18 = 1.0 / (dVar20 * dVar21 - dVar25 * dVar25);
      dVar23 = (dVar9 * dVar25 - dVar21 * dVar22) * dVar18;
      dVar16 = (dVar22 * dVar25 - dVar20 * dVar9) * dVar18;
      local_428.z = local_408.z * dVar16 + dVar23 * 0.0;
      local_428.x = dVar16 * local_408.x + dVar23 * dVar10;
      local_428.y = dVar16 * local_408.y + dVar23 * dVar14;
      dVar16 = (dVar9 * dVar19 - dVar21 * dVar9) * dVar18;
      dVar18 = (dVar9 * dVar25 - dVar19 * dVar20) * dVar18;
      local_448.z = local_408.z * dVar18 + dVar16 * 0.0;
      local_448.x = dVar18 * local_408.x + dVar16 * dVar10;
      local_448.y = dVar18 * local_408.y + dVar16 * dVar14;
      local_468.z = ABS(dVar3) * 5.551115123125786e-16;
      local_468.x = ABS(dVar4) * 5.551115123125786e-16;
      local_468.y = ABS(dVar1) * 5.551115123125786e-16;
      local_488.z = -lr.d.z;
      local_488.x = -lr.d.x;
      local_488.y = -lr.d.y;
      this_00 = (this->super_Shape).localToWorld;
      auVar13._8_8_ = dVar5 - dVar15;
      auVar13._0_8_ =
           ~-(ulong)(dVar11 < 0.0) & (ulong)dVar11 |
           (ulong)(dVar11 + 6.283185307179586) & -(ulong)(dVar11 < 0.0);
      auVar12._8_8_ = dVar17;
      auVar12._0_8_ = 0x401921fb54442d18;
      local_498 = (Point2f)divpd(auVar13,auVar12);
      SurfaceInteraction::SurfaceInteraction
                (&local_1e8,(Point3f *)&local_658,&local_488,&local_468,&local_498,
                 (Vector3f *)&local_4e8,&local_408,&local_428,&local_448,&this->super_Shape);
      Transform::operator()(&local_3a8,this_00,&local_1e8);
      memcpy(si,&local_3a8,0x1b8);
      return true;
    }
  }
  return false;
}

Assistant:

bool Sphere::intersectRay(const Ray& ray, Real* t0, SurfaceInteraction* si,
                          bool testAlpha) const {
    Vector3f roErr, rdErr;
    // Transform ray to local space
    Ray lr = (*worldToLocal)(ray, &roErr, &rdErr);

    // Compute quadratic sphere coefficients
    FPError ox(lr.o.x, roErr.x), oy(lr.o.y, roErr.y), oz(lr.o.z, roErr.z);
    FPError dx(lr.d.x, rdErr.x), dy(lr.d.y, rdErr.y), dz(lr.d.z, rdErr.z);
    FPError a = dx * dx + dy * dy + dz * dz;
    FPError b = 2 * (ox * dx + oy * dy + oz * dz);
    FPError c = ox * ox + oy * oy + oz * oz - FPError(radius) * FPError(radius);

    // Solve quadratic equation for t
    FPError t1, t2;
    // No intersections
    if (!solveQuadraticSystem(a, b, c, &t1, &t2)) return false;

    // Check for trivial range exclusion
    if (t1.upperBound() > lr.tMax || t2.lowerBound() <= 0) return false;
    FPError tt0 = t1;
    if (tt0.lowerBound() <= 0) {
        tt0 = t2; if (tt0.upperBound() > lr.tMax) return false;
    }

    Point3f hpt = lr(Real(tt0));
    // Reproject the point onto the surface to refine it
    hpt *= radius / distance(hpt, Point3f(0, 0, 0));

    if ((zMin > -radius && hpt.z < zMin) || (zMax < radius && hpt.z > zMax)) {
        // If ray origin is inside the sphere and t2 intersects a clipped region
        if (tt0 == t2) return false;
        // We're looking at a hole in the sphere on the near side.
        // Test intersection with the farther side
        if (tt0.upperBound() > lr.tMax) return false;

        // Test with t1 failed, try t2
        tt0 = t2; hpt = lr(Real(tt0));
        // Reproject the point onto the surface to refine it
        hpt *= radius / distance(hpt, Point3f(0, 0, 0));

        if ((zMin > -radius && hpt.z < zMin) || (zMax < radius && hpt.z > zMax))
            return false;
    }

    *t0 = Real(tt0);
    Real twoPi = 2 * Pi, delTheta = thetaMax - thetaMin;

    // Make sure phi = atan(y / x) doesn't result in NaN
    if (hpt.x == 0 && hpt.y == 0) hpt.x = 1e-5f * radius;
    // Compute phi and theta values
    Real phi = std::atan2(hpt.y, hpt.x);
    // Cover the full range [0, 2*Pi] in a continuous cycle
    if (phi < 0) phi += twoPi;
    Real theta = std::acos(clamp(hpt.z / radius, -1, 1));

    // Compute (u, v) parameters from phi and theta
    Real u = phi / twoPi;
    Real v = (theta - thetaMin) / delTheta;

    // Compute partial derivatives for the sphere
    Real hypot = std::sqrt(hpt.x * hpt.x + hpt.y * hpt.y);
    Real invHypot = 1 / hypot;
    Real cosPhi = hpt.x * invHypot, sinPhi = hpt.y * invHypot;

    Vector3f dpdu = Vector3f(-twoPi * hpt.y, twoPi * hpt.x, 0);
    Vector3f dpdv = delTheta * Vector3f(hpt.z * cosPhi, hpt.z * sinPhi, -radius * std::sin(theta));

    // Compute second derivatives
    Vector3f d2pduu = -twoPi * twoPi * Vector3f(hpt.x, hpt.y, 0);
    Vector3f d2pduv = delTheta * hpt.z * twoPi * Vector3f(-sinPhi, cosPhi, 0);
    Vector3f d2pdvv = -delTheta * delTheta * Vector3f(hpt.x, hpt.y, hpt.z);

    // Compute surface normals
    Normal3f dndu, dndv;
    solveSurfaceNormal(dpdu, dpdv, d2pduu,d2pduv, d2pdvv, &dndu, &dndv);

    // Compute error bounds for ray-sphere intersection
    Vector3f pfError = abs(Vector3f(hpt)) * gamma(5);
    // Initiate the SurfaceInteraction object
    *si = (*localToWorld)(SurfaceInteraction(hpt, -lr.d, pfError,
                                             Point2f(u, v), dpdu, dpdv, dndu, dndv, this));

    return true;
}